

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_atomics_op(JSContext *ctx,JSValue this_obj,int argc,JSValue *argv,int op)

{
  int *piVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  uint *puVar7;
  ulong uVar8;
  double dVar9;
  int64_t iVar10;
  uint8_t v1;
  byte bVar11;
  byte bVar12;
  ushort uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  bool bVar17;
  JSValue JVar18;
  uint32_t v32;
  JSClassID class_id;
  int size_log2;
  JSArrayBuffer *abuf;
  uint local_44;
  JSClassID local_40;
  int local_3c;
  JSArrayBuffer *local_38;
  
  puVar7 = (uint *)js_atomics_get_ptr(ctx,&local_38,&local_3c,&local_40,*argv,argv[1],0);
  uVar15 = 0;
  if (puVar7 == (uint *)0x0) {
LAB_001692e9:
    uVar16 = 0;
    iVar10 = 6;
    uVar8 = 0;
    goto LAB_00169419;
  }
  uVar14 = 0;
  if (op != 7) {
    piVar1 = (int *)argv[2].u.ptr;
    JVar18 = argv[2];
    if (0xfffffff4 < (uint)argv[2].tag) {
      *piVar1 = *piVar1 + 1;
    }
    iVar5 = JS_ToInt32Free(ctx,(int32_t *)&local_44,JVar18);
    uVar14 = local_44;
    if (iVar5 != 0) {
LAB_0016927e:
      uVar16 = 0;
      uVar8 = 0;
      iVar10 = 6;
      goto LAB_00169419;
    }
    if (op == 6) {
      piVar1 = (int *)argv[3].u.ptr;
      JVar18 = argv[3];
      if (0xfffffff4 < (uint)argv[3].tag) {
        *piVar1 = *piVar1 + 1;
      }
      iVar5 = JS_ToInt32Free(ctx,(int32_t *)&local_44,JVar18);
      uVar15 = local_44;
      if (iVar5 != 0) goto LAB_0016927e;
    }
    else {
      uVar15 = 0;
    }
    if (local_38->detached != '\0') {
      JS_ThrowTypeError(ctx,"ArrayBuffer is detached");
      goto LAB_001692e9;
    }
  }
  bVar11 = (byte)uVar14;
  uVar4 = (ushort)uVar14;
  switch(local_3c << 3 | op) {
  case 1:
    bVar12 = (byte)*puVar7;
    do {
      LOCK();
      bVar2 = (byte)*puVar7;
      bVar17 = bVar12 == bVar2;
      if (bVar17) {
        *(byte *)puVar7 = bVar12 & bVar11;
        bVar2 = bVar12;
      }
      bVar12 = bVar2;
      UNLOCK();
    } while (!bVar17);
    goto LAB_0016939e;
  case 2:
    bVar12 = (byte)*puVar7;
    do {
      LOCK();
      bVar2 = (byte)*puVar7;
      bVar17 = bVar12 == bVar2;
      if (bVar17) {
        *(byte *)puVar7 = bVar12 | bVar11;
        bVar2 = bVar12;
      }
      bVar12 = bVar2;
      UNLOCK();
    } while (!bVar17);
    goto LAB_0016939e;
  case 3:
    uVar14 = (uint)(byte)-bVar11;
  case 0:
    LOCK();
    bVar12 = (byte)*puVar7;
    *(byte *)puVar7 = (byte)*puVar7 + (char)uVar14;
    UNLOCK();
    goto LAB_00169385;
  case 4:
    bVar12 = (byte)*puVar7;
    do {
      LOCK();
      bVar2 = (byte)*puVar7;
      bVar17 = bVar12 == bVar2;
      if (bVar17) {
        *(byte *)puVar7 = bVar12 ^ bVar11;
        bVar2 = bVar12;
      }
      bVar12 = bVar2;
      UNLOCK();
    } while (!bVar17);
    goto LAB_0016939e;
  case 5:
    LOCK();
    bVar12 = (byte)*puVar7;
    *(byte *)puVar7 = bVar11;
    UNLOCK();
LAB_00169385:
    uVar6 = (uint)bVar12;
    break;
  case 6:
    LOCK();
    if (bVar11 == (byte)*puVar7) {
      *(byte *)puVar7 = (byte)uVar15;
    }
    else {
      uVar14 = (uint)(byte)*puVar7;
    }
    bVar12 = (byte)uVar14;
    UNLOCK();
    goto LAB_0016939e;
  case 7:
    bVar12 = (byte)*puVar7;
LAB_0016939e:
    uVar6 = (uint)bVar12;
    break;
  case 9:
    uVar13 = (ushort)*puVar7;
    do {
      LOCK();
      uVar3 = (ushort)*puVar7;
      bVar17 = uVar13 == uVar3;
      if (bVar17) {
        *(ushort *)puVar7 = uVar13 & uVar4;
        uVar3 = uVar13;
      }
      uVar13 = uVar3;
      UNLOCK();
    } while (!bVar17);
    goto LAB_001693bf;
  case 10:
    uVar13 = (ushort)*puVar7;
    do {
      LOCK();
      uVar3 = (ushort)*puVar7;
      bVar17 = uVar13 == uVar3;
      if (bVar17) {
        *(ushort *)puVar7 = uVar13 | uVar4;
        uVar3 = uVar13;
      }
      uVar13 = uVar3;
      UNLOCK();
    } while (!bVar17);
    goto LAB_001693bf;
  case 0xb:
    uVar14 = -uVar14;
  case 8:
    LOCK();
    uVar13 = (ushort)*puVar7;
    *(ushort *)puVar7 = (ushort)*puVar7 + (short)uVar14;
    UNLOCK();
    goto LAB_00169392;
  case 0xc:
    uVar13 = (ushort)*puVar7;
    do {
      LOCK();
      uVar3 = (ushort)*puVar7;
      bVar17 = uVar13 == uVar3;
      if (bVar17) {
        *(ushort *)puVar7 = uVar13 ^ uVar4;
        uVar3 = uVar13;
      }
      uVar13 = uVar3;
      UNLOCK();
    } while (!bVar17);
LAB_001693bf:
    uVar6 = (uint)uVar13;
    break;
  case 0xd:
    LOCK();
    uVar13 = (ushort)*puVar7;
    *(ushort *)puVar7 = uVar4;
    UNLOCK();
LAB_00169392:
    uVar6 = (uint)uVar13;
    break;
  case 0xe:
    LOCK();
    if (uVar4 == (ushort)*puVar7) {
      *(ushort *)puVar7 = (ushort)uVar15;
    }
    else {
      uVar14 = (uint)(ushort)*puVar7;
    }
    uVar4 = (ushort)uVar14;
    UNLOCK();
    goto LAB_00169350;
  case 0xf:
    uVar4 = (ushort)*puVar7;
LAB_00169350:
    uVar6 = (uint)uVar4;
    break;
  case 0x11:
    uVar6 = *puVar7;
    do {
      LOCK();
      uVar15 = *puVar7;
      bVar17 = uVar6 == uVar15;
      if (bVar17) {
        *puVar7 = uVar6 & uVar14;
        uVar15 = uVar6;
      }
      uVar6 = uVar15;
      UNLOCK();
    } while (!bVar17);
    break;
  case 0x12:
    uVar15 = *puVar7;
    do {
      LOCK();
      uVar6 = *puVar7;
      bVar17 = uVar15 == uVar6;
      if (bVar17) {
        *puVar7 = uVar15 | uVar14;
        uVar6 = uVar15;
      }
      UNLOCK();
      uVar15 = uVar6;
    } while (!bVar17);
    break;
  case 0x13:
    uVar14 = -uVar14;
  case 0x10:
    LOCK();
    uVar6 = *puVar7;
    *puVar7 = *puVar7 + uVar14;
    UNLOCK();
    break;
  case 0x14:
    uVar15 = *puVar7;
    do {
      LOCK();
      uVar6 = *puVar7;
      bVar17 = uVar15 == uVar6;
      if (bVar17) {
        *puVar7 = uVar15 ^ uVar14;
        uVar6 = uVar15;
      }
      UNLOCK();
      uVar15 = uVar6;
    } while (!bVar17);
    break;
  case 0x15:
    LOCK();
    uVar6 = *puVar7;
    *puVar7 = uVar14;
    UNLOCK();
    break;
  case 0x16:
    LOCK();
    uVar6 = *puVar7;
    if (uVar14 == uVar6) {
      *puVar7 = uVar15;
      uVar6 = uVar14;
    }
    UNLOCK();
    break;
  case 0x17:
    uVar6 = *puVar7;
    break;
  default:
    goto switchD_0016924a_default;
  }
  switch(local_40) {
  case 0x16:
    uVar6 = (uint)(char)uVar6;
    break;
  case 0x17:
    uVar6 = uVar6 & 0xff;
    break;
  case 0x18:
    uVar6 = (uint)(short)uVar6;
    break;
  case 0x19:
    uVar6 = uVar6 & 0xffff;
    break;
  case 0x1a:
    break;
  case 0x1b:
    dVar9 = (double)uVar6;
    if (-1 < (int)uVar6) {
      dVar9 = (double)(ulong)uVar6;
    }
    iVar10 = 7;
    if (-1 < (int)uVar6) {
      iVar10 = 0;
    }
    goto LAB_00169409;
  default:
switchD_0016924a_default:
    abort();
  }
  dVar9 = (double)(ulong)uVar6;
  iVar10 = 0;
LAB_00169409:
  uVar8 = (ulong)dVar9 & 0x7fffffff00000000;
  uVar16 = (ulong)dVar9 & 0xffffffff;
LAB_00169419:
  JVar18.tag = iVar10;
  JVar18.u.ptr = (void *)(uVar16 | uVar8);
  return JVar18;
}

Assistant:

static JSValue js_atomics_op(JSContext *ctx,
                             JSValueConst this_obj,
                             int argc, JSValueConst *argv, int op)
{
    int size_log2;
#ifdef CONFIG_BIGNUM
    uint64_t v, a, rep_val;
#else
    uint32_t v, a, rep_val;
#endif
    void *ptr;
    JSValue ret;
    JSClassID class_id;
    JSArrayBuffer *abuf;

    ptr = js_atomics_get_ptr(ctx, &abuf, &size_log2, &class_id,
                             argv[0], argv[1], 0);
    if (!ptr)
        return JS_EXCEPTION;
    rep_val = 0;
    if (op == ATOMICS_OP_LOAD) {
        v = 0;
    } else {
#ifdef CONFIG_BIGNUM
        if (size_log2 == 3) {
            int64_t v64;
            if (JS_ToBigInt64(ctx, &v64, argv[2]))
                return JS_EXCEPTION;
            v = v64;
            if (op == ATOMICS_OP_COMPARE_EXCHANGE) {
                if (JS_ToBigInt64(ctx, &v64, argv[3]))
                    return JS_EXCEPTION;
                rep_val = v64;
            }
        } else
#endif
        {
                uint32_t v32;
                if (JS_ToUint32(ctx, &v32, argv[2]))
                    return JS_EXCEPTION;
                v = v32;
                if (op == ATOMICS_OP_COMPARE_EXCHANGE) {
                    if (JS_ToUint32(ctx, &v32, argv[3]))
                        return JS_EXCEPTION;
                    rep_val = v32;
                }
        }
        if (abuf->detached)
            return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
   }

   switch(op | (size_log2 << 3)) {
            
#ifdef CONFIG_BIGNUM
#define OP(op_name, func_name)                          \
    case ATOMICS_OP_ ## op_name | (0 << 3):             \
       a = func_name((_Atomic(uint8_t) *)ptr, v);       \
       break;                                           \
    case ATOMICS_OP_ ## op_name | (1 << 3):             \
        a = func_name((_Atomic(uint16_t) *)ptr, v);     \
        break;                                          \
    case ATOMICS_OP_ ## op_name | (2 << 3):             \
        a = func_name((_Atomic(uint32_t) *)ptr, v);     \
        break;                                          \
    case ATOMICS_OP_ ## op_name | (3 << 3):             \
        a = func_name((_Atomic(uint64_t) *)ptr, v);     \
        break;
#else
#define OP(op_name, func_name)                          \
    case ATOMICS_OP_ ## op_name | (0 << 3):             \
       a = func_name((_Atomic(uint8_t) *)ptr, v);       \
       break;                                           \
    case ATOMICS_OP_ ## op_name | (1 << 3):             \
        a = func_name((_Atomic(uint16_t) *)ptr, v);     \
        break;                                          \
    case ATOMICS_OP_ ## op_name | (2 << 3):             \
        a = func_name((_Atomic(uint32_t) *)ptr, v);     \
        break;
#endif
        OP(ADD, atomic_fetch_add)
        OP(AND, atomic_fetch_and)
        OP(OR, atomic_fetch_or)
        OP(SUB, atomic_fetch_sub)
        OP(XOR, atomic_fetch_xor)
        OP(EXCHANGE, atomic_exchange)
#undef OP

    case ATOMICS_OP_LOAD | (0 << 3):
        a = atomic_load((_Atomic(uint8_t) *)ptr);
        break;
    case ATOMICS_OP_LOAD | (1 << 3):
        a = atomic_load((_Atomic(uint16_t) *)ptr);
        break;
    case ATOMICS_OP_LOAD | (2 << 3):
        a = atomic_load((_Atomic(uint32_t) *)ptr);
        break;
#ifdef CONFIG_BIGNUM
    case ATOMICS_OP_LOAD | (3 << 3):
        a = atomic_load((_Atomic(uint64_t) *)ptr);
        break;
#endif
        
    case ATOMICS_OP_COMPARE_EXCHANGE | (0 << 3):
        {
            uint8_t v1 = v;
            atomic_compare_exchange_strong((_Atomic(uint8_t) *)ptr, &v1, rep_val);
            a = v1;
        }
        break;
    case ATOMICS_OP_COMPARE_EXCHANGE | (1 << 3):
        {
            uint16_t v1 = v;
            atomic_compare_exchange_strong((_Atomic(uint16_t) *)ptr, &v1, rep_val);
            a = v1;
        }
        break;
    case ATOMICS_OP_COMPARE_EXCHANGE | (2 << 3):
        {
            uint32_t v1 = v;
            atomic_compare_exchange_strong((_Atomic(uint32_t) *)ptr, &v1, rep_val);
            a = v1;
        }
        break;
#ifdef CONFIG_BIGNUM
    case ATOMICS_OP_COMPARE_EXCHANGE | (3 << 3):
        {
            uint64_t v1 = v;
            atomic_compare_exchange_strong((_Atomic(uint64_t) *)ptr, &v1, rep_val);
            a = v1;
        }
        break;
#endif
    default:
        abort();
    }

    switch(class_id) {
    case JS_CLASS_INT8_ARRAY:
        a = (int8_t)a;
        goto done;
    case JS_CLASS_UINT8_ARRAY:
        a = (uint8_t)a;
        goto done;
    case JS_CLASS_INT16_ARRAY:
        a = (int16_t)a;
        goto done;
    case JS_CLASS_UINT16_ARRAY:
        a = (uint16_t)a;
        goto done;
    case JS_CLASS_INT32_ARRAY:
    done:
        ret = JS_NewInt32(ctx, a);
        break;
    case JS_CLASS_UINT32_ARRAY:
        ret = JS_NewUint32(ctx, a);
        break;
#ifdef CONFIG_BIGNUM
    case JS_CLASS_BIG_INT64_ARRAY:
        ret = JS_NewBigInt64(ctx, a);
        break;
    case JS_CLASS_BIG_UINT64_ARRAY:
        ret = JS_NewBigUint64(ctx, a);
        break;
#endif
    default:
        abort();
    }
    return ret;
}